

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_fixed.hpp
# Opt level: O3

void __thiscall
protozero::fixed_size_buffer_adaptor::erase_range
          (fixed_size_buffer_adaptor *this,size_t from,size_t to)

{
  ulong uVar1;
  assert_error *this_00;
  long lVar2;
  
  uVar1 = this->m_size;
  if (uVar1 < from) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"from <= m_size");
  }
  else if (uVar1 < to) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"to <= m_size");
  }
  else {
    lVar2 = from - to;
    if (from < to) {
      if (uVar1 - to != 0) {
        memmove(this->m_data + from,this->m_data + to,uVar1 - to);
        to = this->m_size;
      }
      this->m_size = lVar2 + to;
      return;
    }
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"from < to");
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void erase_range(std::size_t from, std::size_t to) {
        protozero_assert(from <= m_size);
        protozero_assert(to <= m_size);
        protozero_assert(from < to);
        std::copy(m_data + to, m_data + m_size, m_data + from);
        m_size -= (to - from);
    }